

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_make_parent_dirs(char *path)

{
  int iVar1;
  char *s;
  int *piVar2;
  char *pcStack_28;
  int rv;
  char *p;
  char *dup;
  char *path_local;
  
  s = nni_strdup(path);
  pcStack_28 = s;
  if (s == (char *)0x0) {
    path_local._4_4_ = 2;
  }
  else {
    while (pcStack_28 = strchr(pcStack_28,0x2f), pcStack_28 != (char *)0x0) {
      if (pcStack_28 != s) {
        *pcStack_28 = '\0';
        iVar1 = mkdir(s,0x1c0);
        *pcStack_28 = '/';
        if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
          piVar2 = __errno_location();
          iVar1 = nni_plat_errno(*piVar2);
          nni_strfree(s);
          return iVar1;
        }
      }
      for (; *pcStack_28 == '/'; pcStack_28 = pcStack_28 + 1) {
      }
    }
    nni_strfree(s);
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

static int
nni_plat_make_parent_dirs(const char *path)
{
	char *dup;
	char *p;
	int   rv;

	// creates everything up until the last component.
	if ((dup = nni_strdup(path)) == NULL) {
		return (NNG_ENOMEM);
	}
	p = dup;
	while ((p = strchr(p, '/')) != NULL) {
		if (p != dup) {
			*p = '\0';
			rv = mkdir(dup, S_IRWXU);
			*p = '/';
			if ((rv != 0) && (errno != EEXIST)) {
				rv = nni_plat_errno(errno);
				nni_strfree(dup);
				return (rv);
			}
		}

		// collapse grouped "/" characters
		while (*p == '/') {
			p++;
		}
	}
	nni_strfree(dup);
	return (0);
}